

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void interpolatetest2(void)

{
  double dVar1;
  uint local_88 [2];
  int pos [4];
  double tablet [4];
  double tablei [4];
  double out;
  double val;
  double yhi;
  double ylo;
  int i;
  int N;
  
  tablet[3] = 0.216;
  pos[2] = 0x47ae147b;
  pos[3] = 0x3f847ae1;
  tablet[0] = 0.025;
  tablet[1] = 0.05;
  tablet[2] = 0.1;
  memset(local_88,0,0x10);
  ylo._4_4_ = 4;
  arrayminmax(tablet + 3,4,&yhi,&val);
  dVar1 = interpolate_linear((double *)(pos + 2),tablet + 3,ylo._4_4_,0.059);
  printf("OUT %g \n",dVar1);
  sort1d_ascending(tablet + 3,4,(int *)local_88);
  for (ylo._0_4_ = 0; ylo._0_4_ < 4; ylo._0_4_ = ylo._0_4_ + 1) {
    printf(" %d %g %g",tablet[(long)ylo._0_4_ + 3],tablet[(long)pos[(long)ylo._0_4_ + -2] + 3],
           (ulong)(uint)pos[(long)ylo._0_4_ + -2]);
  }
  return;
}

Assistant:

void interpolatetest2() {
	int N,i;
	double ylo,yhi,val,out;

	double tablei[4] = { 0.216, 0.176, 0.146, 0.119};
	double tablet[4] = {0.01, 0.025, 0.05, 0.10};
	int pos[4] = {0,0,0,0};

	val = 0.059;
	N = 4;

	arrayminmax(tablei,N,&ylo,&yhi);


	out = interpolate_linear(tablet,tablei,N,val);

	printf("OUT %g \n",out);

	sort1d_ascending(tablei,4,pos);

	for(i = 0; i < 4; ++i) {
		printf(" %d %g %g",pos[i],tablei[i],tablei[pos[i]]);
	}



}